

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void spr_write_uamor(DisasContext_conflict10 *ctx,int sprn,int gprn)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  
  s = ctx->uc->tcg_ctx;
  ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ts_01 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts_00,(TCGArg)(s->cpu_env + (long)s),0x1600);
  tcg_gen_op3_ppc64(s,INDEX_op_and_i64,(TCGArg)ts_01,(TCGArg)ts_00,
                    (TCGArg)((long)&s->pool_cur + (long)cpu_gpr[gprn]));
  tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),0x1000);
  tcg_gen_andc_i64_ppc64
            (s,(TCGv_i64)((long)ts - (long)s),(TCGv_i64)((long)ts - (long)s),
             (TCGv_i64)((long)ts_00 - (long)s));
  tcg_gen_op3_ppc64(s,INDEX_op_or_i64,(TCGArg)ts,(TCGArg)ts,(TCGArg)ts_01);
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),0x1000);
  tcg_temp_free_internal_ppc64(s,ts);
  tcg_temp_free_internal_ppc64(s,ts_00);
  tcg_temp_free_internal_ppc64(s,ts_01);
  return;
}

Assistant:

static void spr_write_uamor(DisasContext *ctx, int sprn, int gprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    TCGv t2 = tcg_temp_new(tcg_ctx);

    /*
     * Note, the HV=1 case is handled earlier by simply using
     * spr_write_generic for HV mode in the SPR table
     */

    /* Build insertion mask into t1 based on context */
    gen_load_spr(tcg_ctx, t1, SPR_AMOR);

    /* Mask new bits into t2 */
    tcg_gen_and_tl(tcg_ctx, t2, t1, cpu_gpr[gprn]);

    /* Load AMR and clear new bits in t0 */
    gen_load_spr(tcg_ctx, t0, SPR_UAMOR);
    tcg_gen_andc_tl(tcg_ctx, t0, t0, t1);

    /* Or'in new bits and write it out */
    tcg_gen_or_tl(tcg_ctx, t0, t0, t2);
    gen_store_spr(tcg_ctx, SPR_UAMOR, t0);
    spr_store_dump_spr(SPR_UAMOR);

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t2);
}